

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O0

void proto3_unittest::TestHasbits::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  bool bVar1;
  TestHasbits **v1;
  TestHasbits **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  TestAllTypes *pTVar4;
  LogMessage local_90;
  Voidify local_79;
  uint local_78;
  uint32_t cached_has_bits;
  LogMessage local_68;
  Voidify local_51;
  TestHasbits *local_50;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestHasbits *from;
  TestHasbits *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_10;
  
  arena = (Arena *)from_msg;
  from = (TestHasbits *)to_msg;
  _this = (TestHasbits *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_50 = (TestHasbits *)arena;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<proto3_unittest::TestHasbits_const*>
                 (&local_50);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<proto3_unittest::TestHasbits*>(&from)
  ;
  local_48 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto3_unittest::TestHasbits_const*,proto3_unittest::TestHasbits*>
                       (v1,v2,"&from != _this");
  if (local_48 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_48);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3.pb.cc"
               ,0x1c5d,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_68);
  }
  local_78 = 0;
  puVar3 = google::protobuf::internal::HasBits<3>::operator[]
                     ((HasBits<3> *)&(arena->impl_).field_0x10,0);
  local_78 = *puVar3;
  if ((local_78 & 0xff) != 0) {
    if (((local_78 & 1) != 0) && (bVar1 = _internal_b1((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b1_ = (bool)(*(byte *)&(arena->impl_).head_._M_b._M_p & 1);
    }
    if (((local_78 & 2) != 0) && (bVar1 = _internal_b2((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b2_ = (bool)(*(byte *)((long)&(arena->impl_).head_._M_b._M_p + 1) & 1);
    }
    if (((local_78 & 4) != 0) && (bVar1 = _internal_b3((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b3_ = (bool)(*(byte *)((long)&(arena->impl_).head_._M_b._M_p + 2) & 1);
    }
    if (((local_78 & 8) != 0) && (bVar1 = _internal_b4((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b4_ = (bool)(*(byte *)((long)&(arena->impl_).head_._M_b._M_p + 3) & 1);
    }
    if (((local_78 & 0x10) != 0) && (bVar1 = _internal_b5((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b5_ = (bool)(*(byte *)((long)&(arena->impl_).head_._M_b._M_p + 4) & 1);
    }
    if (((local_78 & 0x20) != 0) && (bVar1 = _internal_b6((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b6_ = (bool)(*(byte *)((long)&(arena->impl_).head_._M_b._M_p + 5) & 1);
    }
    if (((local_78 & 0x40) != 0) && (bVar1 = _internal_b7((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b7_ = (bool)(*(byte *)((long)&(arena->impl_).head_._M_b._M_p + 6) & 1);
    }
    if (((local_78 & 0x80) != 0) && (bVar1 = _internal_b8((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b8_ = (bool)(*(byte *)((long)&(arena->impl_).head_._M_b._M_p + 7) & 1);
    }
  }
  if ((local_78 & 0xff00) != 0) {
    if (((local_78 & 0x100) != 0) && (bVar1 = _internal_b9((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b9_ = (bool)(*(byte *)&(arena->impl_).first_owner_ & 1);
    }
    if (((local_78 & 0x200) != 0) && (bVar1 = _internal_b10((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b10_ = (bool)(*(byte *)((long)&(arena->impl_).first_owner_ + 1) & 1);
    }
    if (((local_78 & 0x400) != 0) && (bVar1 = _internal_b11((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b11_ = (bool)(*(byte *)((long)&(arena->impl_).first_owner_ + 2) & 1);
    }
    if (((local_78 & 0x800) != 0) && (bVar1 = _internal_b12((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b12_ = (bool)(*(byte *)((long)&(arena->impl_).first_owner_ + 3) & 1);
    }
    if (((local_78 & 0x1000) != 0) && (bVar1 = _internal_b13((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b13_ = (bool)(*(byte *)((long)&(arena->impl_).first_owner_ + 4) & 1);
    }
    if (((local_78 & 0x2000) != 0) && (bVar1 = _internal_b14((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b14_ = (bool)(*(byte *)((long)&(arena->impl_).first_owner_ + 5) & 1);
    }
    if (((local_78 & 0x4000) != 0) && (bVar1 = _internal_b15((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b15_ = (bool)(*(byte *)((long)&(arena->impl_).first_owner_ + 6) & 1);
    }
    if (((local_78 & 0x8000) != 0) && (bVar1 = _internal_b16((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b16_ = (bool)(*(byte *)((long)&(arena->impl_).first_owner_ + 7) & 1);
    }
  }
  if ((local_78 & 0xff0000) != 0) {
    if (((local_78 & 0x10000) != 0) && (bVar1 = _internal_b17((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b17_ = (bool)(*(byte *)&(arena->impl_).first_arena_.ptr_._M_b._M_p & 1)
      ;
    }
    if (((local_78 & 0x20000) != 0) && (bVar1 = _internal_b18((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b18_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.ptr_._M_b._M_p + 1) & 1);
    }
    if (((local_78 & 0x40000) != 0) && (bVar1 = _internal_b19((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b19_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.ptr_._M_b._M_p + 2) & 1);
    }
    if (((local_78 & 0x80000) != 0) && (bVar1 = _internal_b20((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b20_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.ptr_._M_b._M_p + 3) & 1);
    }
    if (((local_78 & 0x100000) != 0) && (bVar1 = _internal_b21((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b21_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.ptr_._M_b._M_p + 4) & 1);
    }
    if (((local_78 & 0x200000) != 0) && (bVar1 = _internal_b22((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b22_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.ptr_._M_b._M_p + 5) & 1);
    }
    if (((local_78 & 0x400000) != 0) && (bVar1 = _internal_b23((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b23_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.ptr_._M_b._M_p + 6) & 1);
    }
    if (((local_78 & 0x800000) != 0) && (bVar1 = _internal_b24((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b24_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.ptr_._M_b._M_p + 7) & 1);
    }
  }
  if ((local_78 & 0xff000000) != 0) {
    if (((local_78 & 0x1000000) != 0) && (bVar1 = _internal_b25((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b25_ = (bool)(*(byte *)&(arena->impl_).first_arena_.limit_ & 1);
    }
    if (((local_78 & 0x2000000) != 0) && (bVar1 = _internal_b26((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b26_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.limit_ + 1) & 1);
    }
    if (((local_78 & 0x4000000) != 0) && (bVar1 = _internal_b27((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b27_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.limit_ + 2) & 1);
    }
    if (((local_78 & 0x8000000) != 0) && (bVar1 = _internal_b28((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b28_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.limit_ + 3) & 1);
    }
    if (((local_78 & 0x10000000) != 0) && (bVar1 = _internal_b29((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b29_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.limit_ + 4) & 1);
    }
    if (((local_78 & 0x20000000) != 0) && (bVar1 = _internal_b30((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b30_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.limit_ + 5) & 1);
    }
    if (((local_78 & 0x40000000) != 0) && (bVar1 = _internal_b31((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b31_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.limit_ + 6) & 1);
    }
    if ((local_78 & 0x80000000) != 0) {
      if ((arena->impl_).first_arena_.prefetch_ptr_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_90,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3.pb.cc"
                   ,0x1d05,"from._impl_.child_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_90);
      }
      if ((from->field_0)._impl_.child_ == (TestAllTypes *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).first_arena_.prefetch_ptr_;
        local_10 = absl_log_internal_check_op_result;
        pTVar4 = (TestAllTypes *)
                 google::protobuf::Arena::CopyConstruct<proto3_unittest::TestAllTypes>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.child_ = pTVar4;
      }
      else {
        proto3_unittest::TestAllTypes::MergeFrom
                  ((from->field_0)._impl_.child_,
                   (TestAllTypes *)(arena->impl_).first_arena_.prefetch_ptr_);
      }
    }
  }
  puVar3 = google::protobuf::internal::HasBits<3>::operator[]
                     ((HasBits<3> *)&(arena->impl_).field_0x10,1);
  local_78 = *puVar3;
  if ((local_78 & 0xff) != 0) {
    if (((local_78 & 1) != 0) && (bVar1 = _internal_b32((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b32_ =
           (bool)(*(byte *)&(arena->impl_).first_arena_.cleanup_list_.head_ & 1);
    }
    if (((local_78 & 2) != 0) && (bVar1 = _internal_b33((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b33_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.head_ + 1) & 1);
    }
    if (((local_78 & 4) != 0) && (bVar1 = _internal_b34((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b34_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.head_ + 2) & 1);
    }
    if (((local_78 & 8) != 0) && (bVar1 = _internal_b35((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b35_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.head_ + 3) & 1);
    }
    if (((local_78 & 0x10) != 0) && (bVar1 = _internal_b36((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b36_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.head_ + 4) & 1);
    }
    if (((local_78 & 0x20) != 0) && (bVar1 = _internal_b37((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b37_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.head_ + 5) & 1);
    }
    if (((local_78 & 0x40) != 0) && (bVar1 = _internal_b38((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b38_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.head_ + 6) & 1);
    }
    if (((local_78 & 0x80) != 0) && (bVar1 = _internal_b39((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b39_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.head_ + 7) & 1);
    }
  }
  if ((local_78 & 0xff00) != 0) {
    if (((local_78 & 0x100) != 0) && (bVar1 = _internal_b40((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b40_ =
           (bool)(*(byte *)&(arena->impl_).first_arena_.cleanup_list_.next_ & 1);
    }
    if (((local_78 & 0x200) != 0) && (bVar1 = _internal_b41((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b41_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.next_ + 1) & 1);
    }
    if (((local_78 & 0x400) != 0) && (bVar1 = _internal_b42((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b42_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.next_ + 2) & 1);
    }
    if (((local_78 & 0x800) != 0) && (bVar1 = _internal_b43((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b43_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.next_ + 3) & 1);
    }
    if (((local_78 & 0x1000) != 0) && (bVar1 = _internal_b44((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b44_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.next_ + 4) & 1);
    }
    if (((local_78 & 0x2000) != 0) && (bVar1 = _internal_b45((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b45_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.next_ + 5) & 1);
    }
    if (((local_78 & 0x4000) != 0) && (bVar1 = _internal_b46((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b46_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.next_ + 6) & 1);
    }
    if (((local_78 & 0x8000) != 0) && (bVar1 = _internal_b47((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b47_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.next_ + 7) & 1);
    }
  }
  if ((local_78 & 0xff0000) != 0) {
    if (((local_78 & 0x10000) != 0) && (bVar1 = _internal_b48((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b48_ =
           (bool)(*(byte *)&(arena->impl_).first_arena_.cleanup_list_.limit_ & 1);
    }
    if (((local_78 & 0x20000) != 0) && (bVar1 = _internal_b49((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b49_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.limit_ + 1) & 1);
    }
    if (((local_78 & 0x40000) != 0) && (bVar1 = _internal_b50((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b50_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.limit_ + 2) & 1);
    }
    if (((local_78 & 0x80000) != 0) && (bVar1 = _internal_b51((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b51_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.limit_ + 3) & 1);
    }
    if (((local_78 & 0x100000) != 0) && (bVar1 = _internal_b52((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b52_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.limit_ + 4) & 1);
    }
    if (((local_78 & 0x200000) != 0) && (bVar1 = _internal_b53((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b53_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.limit_ + 5) & 1);
    }
    if (((local_78 & 0x400000) != 0) && (bVar1 = _internal_b54((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b54_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.limit_ + 6) & 1);
    }
    if (((local_78 & 0x800000) != 0) && (bVar1 = _internal_b55((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b55_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.limit_ + 7) & 1);
    }
  }
  if ((local_78 & 0xff000000) != 0) {
    if (((local_78 & 0x1000000) != 0) && (bVar1 = _internal_b56((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b56_ =
           (bool)(*(byte *)&(arena->impl_).first_arena_.cleanup_list_.prefetch_ptr_ & 1);
    }
    if (((local_78 & 0x2000000) != 0) && (bVar1 = _internal_b57((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b57_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.prefetch_ptr_ + 1) & 1)
      ;
    }
    if (((local_78 & 0x4000000) != 0) && (bVar1 = _internal_b58((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b58_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.prefetch_ptr_ + 2) & 1)
      ;
    }
    if (((local_78 & 0x8000000) != 0) && (bVar1 = _internal_b59((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b59_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.prefetch_ptr_ + 3) & 1)
      ;
    }
    if (((local_78 & 0x10000000) != 0) && (bVar1 = _internal_b60((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b60_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.prefetch_ptr_ + 4) & 1)
      ;
    }
    if (((local_78 & 0x20000000) != 0) && (bVar1 = _internal_b61((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b61_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.prefetch_ptr_ + 5) & 1)
      ;
    }
    if (((local_78 & 0x40000000) != 0) && (bVar1 = _internal_b62((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b62_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.prefetch_ptr_ + 6) & 1)
      ;
    }
    if (((local_78 & 0x80000000) != 0) && (bVar1 = _internal_b63((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b63_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.cleanup_list_.prefetch_ptr_ + 7) & 1)
      ;
    }
  }
  puVar3 = google::protobuf::internal::HasBits<3>::operator[]
                     ((HasBits<3> *)&(arena->impl_).field_0x10,2);
  local_78 = *puVar3;
  if ((local_78 & 0x3f) != 0) {
    if (((local_78 & 1) != 0) && (bVar1 = _internal_b64((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b64_ =
           (bool)(*(byte *)&(arena->impl_).first_arena_.string_block_._M_b._M_p & 1);
    }
    if (((local_78 & 2) != 0) && (bVar1 = _internal_b65((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b65_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.string_block_._M_b._M_p + 1) & 1);
    }
    if (((local_78 & 4) != 0) && (bVar1 = _internal_b66((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b66_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.string_block_._M_b._M_p + 2) & 1);
    }
    if (((local_78 & 8) != 0) && (bVar1 = _internal_b67((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b67_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.string_block_._M_b._M_p + 3) & 1);
    }
    if (((local_78 & 0x10) != 0) && (bVar1 = _internal_b68((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b68_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.string_block_._M_b._M_p + 4) & 1);
    }
    if (((local_78 & 0x20) != 0) && (bVar1 = _internal_b69((TestHasbits *)arena), bVar1)) {
      (from->field_0)._impl_.b69_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.string_block_._M_b._M_p + 5) & 1);
    }
  }
  google::protobuf::internal::HasBits<3>::Or
            (&(from->field_0)._impl_._has_bits_,(HasBits<3> *)&(arena->impl_).field_0x10);
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestHasbits::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestHasbits*>(&to_msg);
  auto& from = static_cast<const TestHasbits&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_unittest.TestHasbits)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (from._internal_b1() != 0) {
        _this->_impl_.b1_ = from._impl_.b1_;
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (from._internal_b2() != 0) {
        _this->_impl_.b2_ = from._impl_.b2_;
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (from._internal_b3() != 0) {
        _this->_impl_.b3_ = from._impl_.b3_;
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (from._internal_b4() != 0) {
        _this->_impl_.b4_ = from._impl_.b4_;
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (from._internal_b5() != 0) {
        _this->_impl_.b5_ = from._impl_.b5_;
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (from._internal_b6() != 0) {
        _this->_impl_.b6_ = from._impl_.b6_;
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      if (from._internal_b7() != 0) {
        _this->_impl_.b7_ = from._impl_.b7_;
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      if (from._internal_b8() != 0) {
        _this->_impl_.b8_ = from._impl_.b8_;
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      if (from._internal_b9() != 0) {
        _this->_impl_.b9_ = from._impl_.b9_;
      }
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      if (from._internal_b10() != 0) {
        _this->_impl_.b10_ = from._impl_.b10_;
      }
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      if (from._internal_b11() != 0) {
        _this->_impl_.b11_ = from._impl_.b11_;
      }
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      if (from._internal_b12() != 0) {
        _this->_impl_.b12_ = from._impl_.b12_;
      }
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      if (from._internal_b13() != 0) {
        _this->_impl_.b13_ = from._impl_.b13_;
      }
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      if (from._internal_b14() != 0) {
        _this->_impl_.b14_ = from._impl_.b14_;
      }
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      if (from._internal_b15() != 0) {
        _this->_impl_.b15_ = from._impl_.b15_;
      }
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      if (from._internal_b16() != 0) {
        _this->_impl_.b16_ = from._impl_.b16_;
      }
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      if (from._internal_b17() != 0) {
        _this->_impl_.b17_ = from._impl_.b17_;
      }
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      if (from._internal_b18() != 0) {
        _this->_impl_.b18_ = from._impl_.b18_;
      }
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      if (from._internal_b19() != 0) {
        _this->_impl_.b19_ = from._impl_.b19_;
      }
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (from._internal_b20() != 0) {
        _this->_impl_.b20_ = from._impl_.b20_;
      }
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (from._internal_b21() != 0) {
        _this->_impl_.b21_ = from._impl_.b21_;
      }
    }
    if ((cached_has_bits & 0x00200000u) != 0) {
      if (from._internal_b22() != 0) {
        _this->_impl_.b22_ = from._impl_.b22_;
      }
    }
    if ((cached_has_bits & 0x00400000u) != 0) {
      if (from._internal_b23() != 0) {
        _this->_impl_.b23_ = from._impl_.b23_;
      }
    }
    if ((cached_has_bits & 0x00800000u) != 0) {
      if (from._internal_b24() != 0) {
        _this->_impl_.b24_ = from._impl_.b24_;
      }
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    if ((cached_has_bits & 0x01000000u) != 0) {
      if (from._internal_b25() != 0) {
        _this->_impl_.b25_ = from._impl_.b25_;
      }
    }
    if ((cached_has_bits & 0x02000000u) != 0) {
      if (from._internal_b26() != 0) {
        _this->_impl_.b26_ = from._impl_.b26_;
      }
    }
    if ((cached_has_bits & 0x04000000u) != 0) {
      if (from._internal_b27() != 0) {
        _this->_impl_.b27_ = from._impl_.b27_;
      }
    }
    if ((cached_has_bits & 0x08000000u) != 0) {
      if (from._internal_b28() != 0) {
        _this->_impl_.b28_ = from._impl_.b28_;
      }
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      if (from._internal_b29() != 0) {
        _this->_impl_.b29_ = from._impl_.b29_;
      }
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      if (from._internal_b30() != 0) {
        _this->_impl_.b30_ = from._impl_.b30_;
      }
    }
    if ((cached_has_bits & 0x40000000u) != 0) {
      if (from._internal_b31() != 0) {
        _this->_impl_.b31_ = from._impl_.b31_;
      }
    }
    if ((cached_has_bits & 0x80000000u) != 0) {
      ABSL_DCHECK(from._impl_.child_ != nullptr);
      if (_this->_impl_.child_ == nullptr) {
        _this->_impl_.child_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.child_);
      } else {
        _this->_impl_.child_->MergeFrom(*from._impl_.child_);
      }
    }
  }
  cached_has_bits = from._impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (from._internal_b32() != 0) {
        _this->_impl_.b32_ = from._impl_.b32_;
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (from._internal_b33() != 0) {
        _this->_impl_.b33_ = from._impl_.b33_;
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (from._internal_b34() != 0) {
        _this->_impl_.b34_ = from._impl_.b34_;
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (from._internal_b35() != 0) {
        _this->_impl_.b35_ = from._impl_.b35_;
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (from._internal_b36() != 0) {
        _this->_impl_.b36_ = from._impl_.b36_;
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (from._internal_b37() != 0) {
        _this->_impl_.b37_ = from._impl_.b37_;
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      if (from._internal_b38() != 0) {
        _this->_impl_.b38_ = from._impl_.b38_;
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      if (from._internal_b39() != 0) {
        _this->_impl_.b39_ = from._impl_.b39_;
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      if (from._internal_b40() != 0) {
        _this->_impl_.b40_ = from._impl_.b40_;
      }
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      if (from._internal_b41() != 0) {
        _this->_impl_.b41_ = from._impl_.b41_;
      }
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      if (from._internal_b42() != 0) {
        _this->_impl_.b42_ = from._impl_.b42_;
      }
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      if (from._internal_b43() != 0) {
        _this->_impl_.b43_ = from._impl_.b43_;
      }
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      if (from._internal_b44() != 0) {
        _this->_impl_.b44_ = from._impl_.b44_;
      }
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      if (from._internal_b45() != 0) {
        _this->_impl_.b45_ = from._impl_.b45_;
      }
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      if (from._internal_b46() != 0) {
        _this->_impl_.b46_ = from._impl_.b46_;
      }
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      if (from._internal_b47() != 0) {
        _this->_impl_.b47_ = from._impl_.b47_;
      }
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      if (from._internal_b48() != 0) {
        _this->_impl_.b48_ = from._impl_.b48_;
      }
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      if (from._internal_b49() != 0) {
        _this->_impl_.b49_ = from._impl_.b49_;
      }
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      if (from._internal_b50() != 0) {
        _this->_impl_.b50_ = from._impl_.b50_;
      }
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (from._internal_b51() != 0) {
        _this->_impl_.b51_ = from._impl_.b51_;
      }
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (from._internal_b52() != 0) {
        _this->_impl_.b52_ = from._impl_.b52_;
      }
    }
    if ((cached_has_bits & 0x00200000u) != 0) {
      if (from._internal_b53() != 0) {
        _this->_impl_.b53_ = from._impl_.b53_;
      }
    }
    if ((cached_has_bits & 0x00400000u) != 0) {
      if (from._internal_b54() != 0) {
        _this->_impl_.b54_ = from._impl_.b54_;
      }
    }
    if ((cached_has_bits & 0x00800000u) != 0) {
      if (from._internal_b55() != 0) {
        _this->_impl_.b55_ = from._impl_.b55_;
      }
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    if ((cached_has_bits & 0x01000000u) != 0) {
      if (from._internal_b56() != 0) {
        _this->_impl_.b56_ = from._impl_.b56_;
      }
    }
    if ((cached_has_bits & 0x02000000u) != 0) {
      if (from._internal_b57() != 0) {
        _this->_impl_.b57_ = from._impl_.b57_;
      }
    }
    if ((cached_has_bits & 0x04000000u) != 0) {
      if (from._internal_b58() != 0) {
        _this->_impl_.b58_ = from._impl_.b58_;
      }
    }
    if ((cached_has_bits & 0x08000000u) != 0) {
      if (from._internal_b59() != 0) {
        _this->_impl_.b59_ = from._impl_.b59_;
      }
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      if (from._internal_b60() != 0) {
        _this->_impl_.b60_ = from._impl_.b60_;
      }
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      if (from._internal_b61() != 0) {
        _this->_impl_.b61_ = from._impl_.b61_;
      }
    }
    if ((cached_has_bits & 0x40000000u) != 0) {
      if (from._internal_b62() != 0) {
        _this->_impl_.b62_ = from._impl_.b62_;
      }
    }
    if ((cached_has_bits & 0x80000000u) != 0) {
      if (from._internal_b63() != 0) {
        _this->_impl_.b63_ = from._impl_.b63_;
      }
    }
  }
  cached_has_bits = from._impl_._has_bits_[2];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (from._internal_b64() != 0) {
        _this->_impl_.b64_ = from._impl_.b64_;
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (from._internal_b65() != 0) {
        _this->_impl_.b65_ = from._impl_.b65_;
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (from._internal_b66() != 0) {
        _this->_impl_.b66_ = from._impl_.b66_;
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (from._internal_b67() != 0) {
        _this->_impl_.b67_ = from._impl_.b67_;
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (from._internal_b68() != 0) {
        _this->_impl_.b68_ = from._impl_.b68_;
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (from._internal_b69() != 0) {
        _this->_impl_.b69_ = from._impl_.b69_;
      }
    }
  }
  _this->_impl_._has_bits_.Or(from._impl_._has_bits_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}